

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaBlockBufferImageGranularity::AllocPages
          (VmaBlockBufferImageGranularity *this,uint8_t allocType,VkDeviceSize offset,
          VkDeviceSize size)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint8_t in_SIL;
  VmaBlockBufferImageGranularity *in_RDI;
  uint32_t endPage;
  uint32_t startPage;
  VkDeviceSize in_stack_ffffffffffffffc8;
  
  bVar1 = IsEnabled(in_RDI);
  if (bVar1) {
    uVar2 = GetStartPage(in_RDI,in_stack_ffffffffffffffc8);
    AllocPage(in_RDI,in_RDI->m_RegionInfo + uVar2,in_SIL);
    uVar3 = GetEndPage(in_RDI,in_stack_ffffffffffffffc8,0x2ec194);
    if (uVar2 != uVar3) {
      AllocPage(in_RDI,in_RDI->m_RegionInfo + uVar3,in_SIL);
    }
  }
  return;
}

Assistant:

void VmaBlockBufferImageGranularity::AllocPages(uint8_t allocType, VkDeviceSize offset, VkDeviceSize size)
{
    if (IsEnabled())
    {
        uint32_t startPage = GetStartPage(offset);
        AllocPage(m_RegionInfo[startPage], allocType);

        uint32_t endPage = GetEndPage(offset, size);
        if (startPage != endPage)
            AllocPage(m_RegionInfo[endPage], allocType);
    }
}